

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.h
# Opt level: O2

uint32_t __thiscall
snestistics::EmulateRegisters::read_long
          (EmulateRegisters *this,uint32_t address,MemoryAccessType reason)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  uint uVar3;
  
  uVar2 = remap(this,address);
  puVar1 = this->_memory;
  uVar3 = (uint)CONCAT12(puVar1[uVar2 + 2],CONCAT11(puVar1[uVar2 + 1],puVar1[uVar2]));
  if (this->_read_function != (memoryAccessFunc)0x0) {
    (*this->_read_function)(this->_callback_context,address,uVar2,uVar3,3,reason);
  }
  return uVar3;
}

Assistant:

inline uint32_t read_long(uint32_t address, MemoryAccessType reason) const {
		uint32_t r = remap(address);
		uint32_t result = _memory[r];
		result |= _memory[r + 1] << 8;
		result |= _memory[r + 2] << 16;
		if (_read_function)
			(*_read_function)(_callback_context, address, r, result, 3, reason);
		return result;
	}